

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

sexp_conflict sexp_make_signal_set_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  undefined1 auVar1 [16];
  long in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res0;
  sexp_conflict res;
  sigset_t *tmp0;
  int err;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  sexp_conflict local_30;
  sigset_t *local_28;
  int local_1c;
  long local_10;
  long local_8;
  
  local_1c = 0;
  local_38 = 0x43e;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_48,0,0x10);
  local_48 = &local_38;
  local_40 = *(undefined8 *)(local_8 + 0x6080);
  *(undefined8 ***)(local_8 + 0x6080) = &local_48;
  local_28 = (sigset_t *)calloc(1,0x81);
  local_1c = sigemptyset(local_28);
  if (local_1c == 0) {
    auVar1._8_8_ = (long)*(ulong *)(local_10 + 0x30) >> 0x3f;
    auVar1._0_8_ = *(ulong *)(local_10 + 0x30) & 0xfffffffffffffffe;
    local_30 = (sexp_conflict)
               sexp_make_cpointer(local_8,SUB168(auVar1 / SEXT816(2),0),local_28,0x3e,1);
  }
  else {
    local_30 = (sexp_conflict)0x3e;
  }
  *(undefined8 *)(local_8 + 0x6080) = local_40;
  return local_30;
}

Assistant:

sexp sexp_make_signal_set_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int err = 0;
  sigset_t *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  tmp0 = (sigset_t*) calloc(1, 1 + sizeof(tmp0[0]));
  err = sigemptyset(tmp0);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res0 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), tmp0, SEXP_FALSE, 1);
  res = res0;
  }
  sexp_gc_release1(ctx);
  return res;
}